

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

bool __thiscall
HighsDomain::ConflictSet::resolveLinearLeq
          (ConflictSet *this,HighsCDouble M,double Mlower,double *vals)

{
  int iVar1;
  HighsVarType HVar2;
  size_type sVar3;
  reference pvVar4;
  pointer pHVar5;
  reference pvVar6;
  reference __b;
  reference pvVar7;
  long *in_RDI;
  double dVar8;
  double dVar9;
  HighsCDouble *pHVar10;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  HighsCDouble HVar11;
  HighsInt last_1;
  double relaxUb;
  double gub;
  double ub;
  HighsInt last;
  double relaxLb;
  double glb;
  double lb;
  HighsInt col;
  HighsInt i;
  LocalDomChg *locdomchg_1;
  ResolveCandidate *reasonDomchg_1;
  HighsInt k_1;
  LocalDomChg locdomchg;
  ResolveCandidate *reasonDomchg;
  HighsInt k;
  double covered;
  HighsCDouble *in_stack_fffffffffffffe08;
  HighsMipSolver *in_stack_fffffffffffffe10;
  reference in_stack_fffffffffffffe18;
  HighsCDouble *in_stack_fffffffffffffe20;
  double in_stack_fffffffffffffe28;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *in_stack_fffffffffffffe30;
  HighsCDouble local_180;
  int local_16c;
  double local_168;
  double local_160;
  HighsCDouble local_158;
  HighsCDouble local_148;
  HighsCDouble local_138;
  HighsMipSolver *local_128;
  double local_120;
  double local_118;
  HighsCDouble local_110;
  int local_fc;
  double local_f8;
  double local_f0;
  HighsCDouble local_e8;
  HighsCDouble local_d8;
  HighsCDouble local_c8;
  double local_b8;
  double local_b0;
  double local_a8;
  HighsInt local_a0;
  HighsInt local_9c;
  reference local_98;
  reference local_90;
  int local_84;
  HighsCDouble local_80;
  HighsInt local_70;
  double local_68;
  undefined8 local_60;
  reference local_58;
  int local_4c;
  HighsCDouble local_48;
  HighsCDouble *local_38;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *local_28;
  
  local_28 = (vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              *)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  std::
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ::clear((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           *)0x5cd87b);
  local_48 = HighsCDouble::operator-
                       ((HighsCDouble *)in_stack_fffffffffffffe10,(double)in_stack_fffffffffffffe08)
  ;
  local_38 = (HighsCDouble *)HighsCDouble::operator_cast_to_double(&local_48);
  if ((double)local_38 < 0.0) {
    for (local_4c = 0; iVar1 = local_4c,
        sVar3 = std::
                vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                ::size((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                        *)(in_RDI + 0x14)), iVar1 < (int)sVar3; local_4c = local_4c + 1) {
      local_58 = std::
                 vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                 ::operator[]((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                               *)(in_RDI + 0x14),(long)local_4c);
      local_70 = local_58->boundPos;
      pvVar4 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                          (*in_RDI + 0x48),(long)local_58->boundPos);
      local_68 = pvVar4->boundval;
      local_60._0_4_ = pvVar4->column;
      local_60._4_4_ = pvVar4->boundtype;
      HighsCDouble::operator+=(in_stack_fffffffffffffe20,(double)in_stack_fffffffffffffe18);
      std::
      vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ::push_back((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_80 = HighsCDouble::operator-
                           ((HighsCDouble *)in_stack_fffffffffffffe10,
                            (double)in_stack_fffffffffffffe08);
      local_38 = (HighsCDouble *)HighsCDouble::operator_cast_to_double(&local_80);
      if (0.0 <= (double)local_38) break;
    }
    pHVar10 = local_38;
    if ((double)local_38 < 0.0) {
      return false;
    }
    dVar8 = HighsDomain::feastol((HighsDomain *)0x5cda3e);
    if (dVar8 < (double)pHVar10) {
      sVar3 = std::
              vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              ::size((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                      *)(in_RDI + 0x11));
      local_84 = (int)sVar3;
      do {
        do {
          while( true ) {
            local_84 = local_84 + -1;
            if (local_84 < 0) {
              return true;
            }
            local_90 = std::
                       vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                       ::operator[]((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                                     *)(in_RDI + 0x14),(long)local_84);
            local_98 = std::
                       vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                       ::operator[]((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                     *)(in_RDI + 0x11),(long)local_84);
            local_9c = local_90->valuePos;
            local_a0 = (local_98->domchg).column;
            if ((local_98->domchg).boundtype != kLower) break;
            local_a8 = (local_98->domchg).boundval;
            local_b0 = local_90->baseBound;
            HVar11 = HighsCDouble::operator-
                               ((HighsCDouble *)in_stack_fffffffffffffe10,
                                (double)in_stack_fffffffffffffe08);
            local_f0 = HVar11.lo;
            local_f8 = HVar11.hi;
            local_e8 = ::operator-((double)in_stack_fffffffffffffe20,
                                   (HighsCDouble *)in_stack_fffffffffffffe18);
            local_d8 = HighsCDouble::operator/(in_stack_fffffffffffffe08,3.00665575632709e-317);
            local_c8 = HighsCDouble::operator+
                                 ((HighsCDouble *)in_stack_fffffffffffffe10,
                                  (double)in_stack_fffffffffffffe08);
            local_b8 = HighsCDouble::operator_cast_to_double(&local_c8);
            HVar2 = HighsMipSolver::variableType
                              (in_stack_fffffffffffffe10,
                               (HighsInt)((ulong)in_stack_fffffffffffffe08 >> 0x20));
            if (HVar2 != kContinuous) {
              local_b8 = ceil(local_b8);
            }
            dVar8 = local_b8 - local_a8;
            dVar9 = HighsDomain::feastol((HighsDomain *)0x5cdc4e);
            if (dVar8 < -dVar9) {
              (local_98->domchg).boundval = local_b8;
              dVar8 = local_b8 - local_b0;
              pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x5cdcc2);
              if (pHVar5->epsilon < dVar8) {
                while (dVar8 = local_b8,
                      pvVar7 = std::
                               vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                               ::operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                             *)(*in_RDI + 0x78),(long)local_98->pos),
                      dVar8 <= pvVar7->first) {
                  pvVar7 = std::
                           vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ::operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                         *)(*in_RDI + 0x78),(long)local_98->pos);
                  local_98->pos = pvVar7->second;
                }
                HighsCDouble::operator+=
                          (in_stack_fffffffffffffe20,(double)in_stack_fffffffffffffe18);
              }
              else {
                sVar3 = std::
                        vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                        ::size((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                *)(in_RDI + 0x11));
                local_fc = (int)sVar3 + -1;
                pvVar6 = std::
                         vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                         ::operator[]((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                       *)(in_RDI + 0x11),(long)local_fc);
                __b = std::
                      vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                      ::operator[]((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                    *)(in_RDI + 0x11),(long)local_84);
                std::swap<HighsDomain::ConflictSet::LocalDomChg>(pvVar6,__b);
                std::
                vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                ::resize(in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
                HighsCDouble::operator-=
                          ((HighsCDouble *)in_stack_fffffffffffffe10,
                           (double)in_stack_fffffffffffffe08);
              }
              local_110 = HighsCDouble::operator-
                                    ((HighsCDouble *)in_stack_fffffffffffffe10,
                                     (double)in_stack_fffffffffffffe08);
              pHVar10 = (HighsCDouble *)HighsCDouble::operator_cast_to_double(&local_110);
              local_38 = pHVar10;
              dVar8 = HighsDomain::feastol((HighsDomain *)0x5cde6b);
              if ((double)pHVar10 <= dVar8) {
                return true;
              }
            }
          }
          local_118 = (local_98->domchg).boundval;
          local_120 = local_90->baseBound;
          in_stack_fffffffffffffe30 = local_28;
          HVar11 = HighsCDouble::operator-
                             ((HighsCDouble *)in_stack_fffffffffffffe10,
                              (double)in_stack_fffffffffffffe08);
          local_160 = HVar11.lo;
          local_168 = HVar11.hi;
          local_158 = ::operator-((double)in_stack_fffffffffffffe20,
                                  (HighsCDouble *)in_stack_fffffffffffffe18);
          local_148 = HighsCDouble::operator/(in_stack_fffffffffffffe08,3.00710535606481e-317);
          local_138 = HighsCDouble::operator+
                                ((HighsCDouble *)in_stack_fffffffffffffe10,
                                 (double)in_stack_fffffffffffffe08);
          local_128 = (HighsMipSolver *)HighsCDouble::operator_cast_to_double(&local_138);
          HVar2 = HighsMipSolver::variableType
                            (in_stack_fffffffffffffe10,
                             (HighsInt)((ulong)in_stack_fffffffffffffe08 >> 0x20));
          if (HVar2 != kContinuous) {
            local_128 = (HighsMipSolver *)floor((double)local_128);
          }
          in_stack_fffffffffffffe28 = (double)local_128 - local_118;
          dVar8 = HighsDomain::feastol((HighsDomain *)0x5cdfdc);
        } while (in_stack_fffffffffffffe28 <= dVar8);
        (local_98->domchg).boundval = (double)local_128;
        in_stack_fffffffffffffe20 = (HighsCDouble *)((double)local_128 - local_120);
        pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5ce036);
        if ((double)in_stack_fffffffffffffe20 < -pHVar5->epsilon) {
          while (in_stack_fffffffffffffe10 = local_128,
                pvVar7 = std::
                         vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                         operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                     *)(*in_RDI + 0x78),(long)local_98->pos),
                pvVar7->first <= (double)in_stack_fffffffffffffe10) {
            pvVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                     operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                 *)(*in_RDI + 0x78),(long)local_98->pos);
            local_98->pos = pvVar7->second;
          }
          HighsCDouble::operator+=(in_stack_fffffffffffffe20,(double)in_stack_fffffffffffffe18);
        }
        else {
          sVar3 = std::
                  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                  ::size((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                          *)(in_RDI + 0x11));
          local_16c = (int)sVar3 + -1;
          in_stack_fffffffffffffe18 =
               std::
               vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
               ::operator[]((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                             *)(in_RDI + 0x11),(long)local_16c);
          pvVar6 = std::
                   vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ::operator[]((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                 *)(in_RDI + 0x11),(long)local_84);
          std::swap<HighsDomain::ConflictSet::LocalDomChg>(in_stack_fffffffffffffe18,pvVar6);
          std::
          vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          ::resize(in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
          HighsCDouble::operator-=
                    ((HighsCDouble *)in_stack_fffffffffffffe10,(double)in_stack_fffffffffffffe08);
        }
        local_180 = HighsCDouble::operator-
                              ((HighsCDouble *)in_stack_fffffffffffffe10,
                               (double)in_stack_fffffffffffffe08);
        in_stack_fffffffffffffe08 =
             (HighsCDouble *)HighsCDouble::operator_cast_to_double(&local_180);
        local_38 = in_stack_fffffffffffffe08;
        dVar8 = HighsDomain::feastol((HighsDomain *)0x5ce1eb);
      } while (dVar8 < (double)in_stack_fffffffffffffe08);
    }
  }
  return true;
}

Assistant:

bool HighsDomain::ConflictSet::resolveLinearLeq(HighsCDouble M, double Mlower,
                                                const double* vals) {
  resolvedDomainChanges.clear();
  double covered = double(M - Mlower);
  if (covered < 0) {
    for (HighsInt k = 0; k < (HighsInt)resolveBuffer.size(); ++k) {
      ResolveCandidate& reasonDomchg = resolveBuffer[k];
      LocalDomChg locdomchg;
      locdomchg.pos = reasonDomchg.boundPos;
      locdomchg.domchg = localdom.domchgstack_[reasonDomchg.boundPos];
      M += reasonDomchg.delta;
      resolvedDomainChanges.push_back(locdomchg);
      assert(resolvedDomainChanges.back().pos >= 0);
      assert(resolvedDomainChanges.back().pos <
             (HighsInt)localdom.domchgstack_.size());
      covered = double(M - Mlower);
      if (covered >= 0) break;
    }

    if (covered < 0) {
      // printf("local bounds reach only value of %.12g, need at least
      // %.12g\n",
      //        M, Mlower);
      return false;
    }

    if (covered > localdom.feastol()) {
      // there is room for relaxing bounds / dropping unneeded bound changes
      // from the explanation
      // HighsInt numRelaxed = 0;
      // HighsInt numDropped = 0;
      for (HighsInt k = resolvedDomainChanges.size() - 1; k >= 0; --k) {
        ResolveCandidate& reasonDomchg = resolveBuffer[k];
        LocalDomChg& locdomchg = resolvedDomainChanges[k];
        HighsInt i = reasonDomchg.valuePos;
        HighsInt col = locdomchg.domchg.column;
        if (locdomchg.domchg.boundtype == HighsBoundType::kLower) {
          double lb = locdomchg.domchg.boundval;
          double glb = reasonDomchg.baseBound;
          double relaxLb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + glb);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxLb = std::ceil(relaxLb);

          if (relaxLb - lb >= -localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxLb;

          if (relaxLb - glb <= localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxLb <= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxLb - lb);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        } else {
          double ub = locdomchg.domchg.boundval;
          double gub = reasonDomchg.baseBound;
          double relaxUb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + gub);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxUb = std::floor(relaxUb);

          if (relaxUb - ub <= localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxUb;

          if (relaxUb - gub >= -localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxUb >= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxUb - ub);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        }
      }

      // if (numRelaxed + numDropped)
      //   printf("relaxed %d and dropped %d of %d resolved domain changes\n",
      //          (int)numRelaxed, (int)numDropped,
      //          (int)resolvedDomainChanges.size());

      assert(covered >= -localdom.mipsolver->mipdata_->feastol);
    }
  }
  return true;
}